

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O0

void testRgbToHsv(Vector3f *rgb)

{
  bool bVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  ostream *poVar4;
  float *in_RDI;
  float fVar5;
  float fVar6;
  Vector3f VVar7;
  float myErr;
  float err;
  Vector3f myRgb2;
  Vector3f myHsv;
  Vector3f rgb2;
  Vector3f hsv;
  Vector3f *in_stack_fffffffffffffef8;
  Vector3f *in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  Vector3<float> *this;
  undefined8 in_stack_ffffffffffffff18;
  Vector3f *in_stack_ffffffffffffff20;
  float *in_stack_ffffffffffffff28;
  Vector3f *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  float local_38;
  float local_30;
  float fStack_2c;
  Vector3<float> local_20;
  Vector3<float> local_14;
  float *local_8;
  
  fVar6 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  fVar5 = (float)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  this = &local_14;
  local_8 = in_RDI;
  sf::Vector3<float>::Vector3(this);
  ImGui::ColorConvertRGBtoHSV
            ((float)((ulong)in_stack_ffffffffffffff20 >> 0x20),SUB84(in_stack_ffffffffffffff20,0),
             fVar5,&this->x,in_stack_ffffffffffffff08,&in_stack_ffffffffffffff00->x);
  sf::Vector3<float>::Vector3(&local_20);
  ImGui::ColorConvertHSVtoRGB
            ((float)((ulong)in_stack_ffffffffffffff40 >> 0x20),(float)in_stack_ffffffffffffff40,
             fVar6,&in_stack_ffffffffffffff30->x,in_stack_ffffffffffffff28,
             &in_stack_ffffffffffffff20->x);
  VVar7 = convertRgbToHsv(in_stack_ffffffffffffff20);
  local_38 = VVar7.z;
  convertHsvToRgb(in_stack_ffffffffffffff30);
  fVar5 = findTotalError(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fVar6 = findTotalError(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  _Var2 = std::setprecision(10);
  std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = std::operator<<((ostream *)&std::cout,"rgb(");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_8);
  poVar4 = std::operator<<(poVar4,", ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8[1]);
  poVar4 = std::operator<<(poVar4,", ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8[2]);
  poVar4 = std::operator<<(poVar4,") -> hsv(");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14.x);
  poVar4 = std::operator<<(poVar4,", ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14.y);
  poVar4 = std::operator<<(poVar4,", ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14.z);
  poVar4 = std::operator<<(poVar4,"), err = ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar5);
  poVar4 = std::operator<<(poVar4,", myErr = ");
  _Var3 = std::setw(0xd);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,fVar6);
  std::operator<<(poVar4,"\n");
  bVar1 = floatEqual(0.0,1.480344e-39);
  if (((!bVar1) || (bVar1 = floatEqual(0.0,1.480385e-39), !bVar1)) ||
     (bVar1 = floatEqual(0.0,1.480426e-39), !bVar1)) {
    _Var3 = std::setw(0x38);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar4 = std::operator<<(poVar4,"MISMATCH: got myHsv(");
    _Var3 = std::setw(0xd);
    poVar4 = std::operator<<(poVar4,_Var3);
    local_30 = VVar7.x;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
    poVar4 = std::operator<<(poVar4,", ");
    _Var3 = std::setw(0xd);
    poVar4 = std::operator<<(poVar4,_Var3);
    fStack_2c = VVar7.y;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,fStack_2c);
    poVar4 = std::operator<<(poVar4,", ");
    _Var3 = std::setw(0xd);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38);
    std::operator<<(poVar4,")\n");
  }
  return;
}

Assistant:

void testRgbToHsv(const sf::Vector3f& rgb) {
    sf::Vector3f hsv;
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, hsv.x, hsv.y, hsv.z);
    sf::Vector3f rgb2;
    ImGui::ColorConvertHSVtoRGB(hsv.x, hsv.y, hsv.z, rgb2.x, rgb2.y, rgb2.z);

    sf::Vector3f myHsv = convertRgbToHsv(rgb);
    sf::Vector3f myRgb2 = convertHsvToRgb(myHsv);

    float err = findTotalError(rgb, rgb2);
    float myErr = findTotalError(rgb, myRgb2);

    std::cout << std::setprecision(10);
    std::cout << "rgb(" << std::setw(13) << rgb.x << ", " << std::setw(13) << rgb.y << ", " << std::setw(13) << rgb.z
        << ") -> hsv(" << std::setw(13) << hsv.x << ", " << std::setw(13) << hsv.y << ", " << std::setw(13) << hsv.z
        << "), err = " << std::setw(13) << err << ", myErr = " << std::setw(13) << myErr << "\n";

    if (floatEqual(hsv.x, myHsv.x) && floatEqual(hsv.y, myHsv.y) && floatEqual(hsv.z, myHsv.z)) {
    } else {
        std::cout << std::setw(56) << "MISMATCH: got myHsv(" << std::setw(13) << myHsv.x << ", " << std::setw(13) << myHsv.y << ", " << std::setw(13) << myHsv.z << ")\n";
        assert(false);
    }
    assert(floatEqual(err, 0.0f));
    assert(floatEqual(myErr, 0.0f));
}